

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_driver.hpp
# Opt level: O1

void __thiscall MC::MC_Driver::oppop(MC_Driver *this,int op)

{
  pointer pbVar1;
  pointer pcVar2;
  long lVar3;
  string c;
  condition cl;
  long *local_b8 [2];
  long local_a8 [2];
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  int local_6c;
  int local_68;
  int local_60;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  int local_38;
  float local_34;
  
  lVar3 = (long)(this->condStack).top;
  pbVar1 = (this->condStack).colunm.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar1[lVar3 + -1]._M_dataplus._M_p;
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,pcVar2,pcVar2 + pbVar1[lVar3 + -1]._M_string_length);
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_90._M_p = (pointer)&local_80;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_assign((string *)&local_90);
  local_6c = (this->condStack).stackTopType;
  local_68 = op;
  local_60 = local_6c;
  if (local_6c == 90000) {
    local_34 = (this->condStack).tempFloat;
  }
  else if (local_6c == 50000) {
    local_38 = (this->condStack).tempInt;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_58);
  }
  std::vector<condition,_std::allocator<condition>_>::push_back
            (this->stmt->c_list,(value_type *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,
                    CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,
                    CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0]) + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  return;
}

Assistant:

void oppop(int op){
        std::string c = condStack.colunm[condStack.top-1];
        struct condition cl;
        cl.colunmName = c;
        cl.op = op;
        cl.type = condStack.stackTopType;
        cl.key.type = condStack.stackTopType;
        if(condStack.stackTopType == 50000){
            //int
            cl.key.intV = condStack.tempInt;
            stmt->c_list->push_back(cl);
            //std::cout<<cl.key.type<<" "<<cl.key.intV<<std::endl;
        }else if(condStack.stackTopType == 90000){
            //float
            cl.key.floatV = condStack.tempFloat;
            stmt->c_list->push_back(cl);
            //std::cout<<cl.key.type<<" "<<cl.key.floatV<<std::endl;
        }else{
            //string
            cl.key.charV = condStack.tempString;
            stmt->c_list->push_back(cl);
            //std::cout<<cl.key.type<<" "<<cl.key.charV<<std::endl;
        }
        
    }